

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O0

string * decodeConnectionErrorType_abi_cxx11_(string *__return_storage_ptr__,uint32_t errcode)

{
  allocator<char> local_1a;
  undefined1 local_19;
  uint local_18;
  uint32_t local_14;
  uint32_t errtype;
  uint32_t errcode_local;
  string *namedtype;
  
  local_18 = errcode & 0xffff;
  local_19 = 0;
  local_14 = errcode;
  _errtype = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"UNKNOWN",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  switch(local_18) {
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"GENERIC");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"PROTOCOL");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"TIMEOUT");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"TEMPUNAVAIL");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"NOADDRESS");
    break;
  case 6:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"UNREACHABLE");
    break;
  case 7:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"UNSUPPORTED");
    break;
  case 8:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"OVERLOADED");
    break;
  case 9:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"AUTH_DENIED");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"DUPLICATE");
    break;
  case 0xb:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"TOOMANYRETRY");
    break;
  case 0xc:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"OUTOFPROXY");
    break;
  case 0xd:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"USER DEFINED");
    break;
  default:
    bd_sprintf_append(__return_storage_ptr__,"(%lu)",(ulong)local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string decodeConnectionErrorType(uint32_t errcode) {
	uint32_t errtype = errcode & BITDHT_CONNECT_ERROR_MASK_TYPE;
	std::string namedtype = "UNKNOWN";
	switch(errtype) {
		default:
			bd_sprintf_append(namedtype, "(%lu)", errtype);
			break;
		case BITDHT_CONNECT_ERROR_GENERIC:
			namedtype = "GENERIC";
			break;
		case BITDHT_CONNECT_ERROR_PROTOCOL:
			namedtype = "PROTOCOL";
			break;
		case BITDHT_CONNECT_ERROR_TIMEOUT:
			namedtype = "TIMEOUT";
			break;
		case BITDHT_CONNECT_ERROR_TEMPUNAVAIL:
			namedtype = "TEMPUNAVAIL";
			break;
		case BITDHT_CONNECT_ERROR_NOADDRESS:
			namedtype = "NOADDRESS";
			break;
		case BITDHT_CONNECT_ERROR_UNREACHABLE:
			namedtype = "UNREACHABLE";
			break;
		case BITDHT_CONNECT_ERROR_UNSUPPORTED:
			namedtype = "UNSUPPORTED";
			break;
		case BITDHT_CONNECT_ERROR_OVERLOADED:
			namedtype = "OVERLOADED";
			break;
		case BITDHT_CONNECT_ERROR_AUTH_DENIED:
			namedtype = "AUTH_DENIED";
			break;
		case BITDHT_CONNECT_ERROR_DUPLICATE:
			namedtype = "DUPLICATE";
			break;
		case BITDHT_CONNECT_ERROR_TOOMANYRETRY:
			namedtype = "TOOMANYRETRY";
			break;
		case BITDHT_CONNECT_ERROR_OUTOFPROXY:
			namedtype = "OUTOFPROXY";
			break;
		case BITDHT_CONNECT_ERROR_USER:
			namedtype = "USER DEFINED";
			break;
	}
	return namedtype;
}